

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

void map_put(Map *map,void *key,void *value)

{
  List *pLVar1;
  ListNode *pLVar2;
  undefined8 *data;
  ulong uVar3;
  
  uVar3 = (ulong)key % (ulong)map->prime;
  if (map->elem[uVar3] == (void *)0x0) {
    pLVar1 = new_list();
    map->elem[uVar3] = pLVar1;
  }
  pLVar1 = (List *)map->elem[(ulong)key % (ulong)map->prime];
  pLVar2 = pLVar1->head;
  while( true ) {
    if (pLVar2 == (ListNode *)0x0) {
      data = (undefined8 *)malloc(0x10);
      *data = key;
      data[1] = value;
      list_add(pLVar1,data);
      map->size = map->size + 1;
      return;
    }
    if (*pLVar2->data == key) break;
    pLVar2 = pLVar2->next;
  }
  *(void **)((long)pLVar2->data + 8) = value;
  return;
}

Assistant:

void map_put(Map *map, void *key, void *value) {
    uint pos = hash_fun(key, map->prime);
    if (map->elem[pos] == NULL) {
        map->elem[pos] = new_list();
    }
    List *els = map_get_(map, key);
    Elem *elem;
    ListNode *node = els->head;
    while (node != NULL) {
        elem = node->data;
        if (hash(key) == hash(elem->key)) {
            elem->value = value;
            return;
        }
        node = node->next;
    }
    list_add(els, new_elem(key, value));
    map->size++;
}